

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O1

Filter * anon_unknown.dwarf_bbcfa::getFilter(HelicsFilter filt,HelicsError *err)

{
  HelicsFilter pvVar1;
  bool bVar2;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (filt == (HelicsFilter)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001b2179;
    }
    else {
      bVar2 = *(int *)((long)filt + 4) == -0x13d9fed9;
      pvVar1 = (HelicsFilter)0x0;
      if (bVar2) {
        pvVar1 = filt;
      }
      if (bVar2 || err == (HelicsError *)0x0) goto LAB_001b217b;
    }
    err->error_code = -3;
    err->message = "The given filter object is not valid";
  }
LAB_001b2179:
  pvVar1 = (HelicsFilter)0x0;
LAB_001b217b:
  if (pvVar1 == (HelicsFilter)0x0) {
    return (Filter *)0x0;
  }
  return *(Filter **)((long)pvVar1 + 8);
}

Assistant:

helics::FilterObject* getFilterObj(HelicsFilter filt, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    if (filt == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidFilterString);
        return nullptr;
    }
    auto* fObj = reinterpret_cast<helics::FilterObject*>(filt);
    if (fObj->valid != filterValidationIdentifier) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidFilterString);
        return nullptr;
    }
    return fObj;
}